

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall
fmp4_stream::media_fragment::patch_tfdt(media_fragment *this,uint64_t patch,uint32_t seq_nr)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference pt;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  value_type local_45;
  value_type local_44;
  value_type local_43;
  value_type local_42;
  undefined1 local_41;
  reference pvStack_40;
  char name [5];
  uint8_t *ptr;
  ulong uStack_30;
  uint temp_off;
  uint64_t offset;
  uint64_t box_size;
  uint32_t seq_nr_local;
  uint64_t patch_local;
  media_fragment *this_local;
  
  if ((this->moof_box_).size_ != 0) {
    uStack_30 = 8;
    if (seq_nr != 0) {
      *(uint32_t *)&(this->mfhd_).super_full_box.field_0x6c = seq_nr;
    }
    (this->tfdt_).base_media_decode_time_ = (this->tfdt_).base_media_decode_time_ + patch;
    while (sVar3 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &(this->moof_box_).box_data_), uStack_30 < sVar3) {
      ptr._4_4_ = 0;
      pt = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &(this->moof_box_).box_data_,uStack_30);
      uVar2 = anon_unknown.dwarf_125f64::fmp4_read_uint32((char *)pt);
      offset = (uint64_t)uVar2;
      pvStack_40 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                   operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &(this->moof_box_).box_data_,0);
      local_45 = pvStack_40[uStack_30 + 4];
      local_44 = pvStack_40[uStack_30 + 5];
      local_43 = pvStack_40[uStack_30 + 6];
      local_42 = pvStack_40[uStack_30 + 7];
      local_41 = 0;
      if (offset == 1) {
        ptr._4_4_ = 8;
        offset = anon_unknown.dwarf_125f64::fmp4_read_uint64((char *)(pvStack_40 + uStack_30 + 8));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"mfhd",&local_69);
      bVar1 = f_compare_4cc((char *)&local_45,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if (bVar1) {
        if (seq_nr != 0) {
          anon_unknown.dwarf_125f64::fmp4_write_uint32
                    (seq_nr,(char *)(pvStack_40 + uStack_30 + ptr._4_4_ + 0xc));
        }
        uStack_30 = offset + uStack_30;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"trun",&local_a1);
        bVar1 = f_compare_4cc((char *)&local_45,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        if (bVar1) {
          uStack_30 = offset + uStack_30;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"tfdt",&local_c9);
          bVar1 = f_compare_4cc((char *)&local_45,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          if (bVar1) {
            if ((this->tfdt_).super_full_box.super_box.field_0x62 == '\0') {
              anon_unknown.dwarf_125f64::fmp4_write_uint32
                        ((uint32_t)(this->tfdt_).base_media_decode_time_,
                         (char *)(pvStack_40 + uStack_30 + ptr._4_4_ + 0xc));
            }
            else {
              anon_unknown.dwarf_125f64::fmp4_write_uint64
                        ((this->tfdt_).base_media_decode_time_,
                         (char *)(pvStack_40 + uStack_30 + ptr._4_4_ + 0xc));
            }
            uStack_30 = offset + uStack_30;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"tfhd",&local_f1)
            ;
            bVar1 = f_compare_4cc((char *)&local_45,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_f1);
            if (bVar1) {
              uStack_30 = offset + uStack_30;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_118,"traf",&local_119);
              bVar1 = f_compare_4cc((char *)&local_45,&local_118);
              std::__cxx11::string::~string((string *)&local_118);
              std::allocator<char>::~allocator((allocator<char> *)&local_119);
              if (bVar1) {
                uStack_30 = uStack_30 + 8;
              }
              else {
                uStack_30 = (offset & 0xffffffff) + uStack_30;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void media_fragment::patch_tfdt(uint64_t patch, uint32_t seq_nr)
	{
		if (!moof_box_.size_)
			return;

		uint64_t box_size = 0;
		uint64_t offset = 8;

		if (seq_nr)
			this->mfhd_.seq_nr_ = seq_nr;

		this->tfdt_.base_media_decode_time_ = \
			this->tfdt_.base_media_decode_time_ + patch;

		// find the tfdt box and overwrite it
		while (moof_box_.box_data_.size() > offset)
		{
			unsigned int temp_off = 0;
			box_size = (uint64_t)fmp4_read_uint32((char *)&moof_box_.box_data_[offset]);
			uint8_t * ptr = &moof_box_.box_data_[0];
			char name[5] = { (char)ptr[offset + 4],(char)ptr[offset + 5],(char)ptr[offset + 6],(char)ptr[offset + 7],'\0' };

			if (box_size == 1) // the box_size is a large size (should not happen in fmp4)
			{
				temp_off = 8;
				box_size = fmp4_read_uint64((char *)& ptr[offset + temp_off]);
			}

			if (f_compare_4cc(name, "mfhd"))
			{
				
				if (seq_nr) 
					fmp4_write_uint32(seq_nr, (char *)&ptr[offset + temp_off + 12]);
				//mfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				//cout << "mfhd size" << box_size << endl;
				continue;
			}

			if (f_compare_4cc(name, "trun"))
			{
				//trun_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name, "tfdt"))
			{
				
				this->tfdt_.version_ ? \
					fmp4_write_uint64(this->tfdt_.base_media_decode_time_, (char *)&ptr[offset + temp_off + 12]) : \
					fmp4_write_uint32((uint32_t)this->tfdt_.base_media_decode_time_, (char *)&ptr[offset + temp_off + 12]);

				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name, "tfhd"))
			{
				//tfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			// cmaf style only one traf box per moof so we skip it
			if (f_compare_4cc(name, "traf"))
			{
				offset += 8;
			}
			else
				offset += (unsigned int)box_size;
		}
	}